

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int vcf_format(bcf_hdr_t *h,bcf1_t *v,kstring_t *s)

{
  byte bVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  BGZF *fp;
  short sVar4;
  char cVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  byte *pbVar12;
  void *pvVar13;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  ushort uVar17;
  ulong extraout_RDX;
  bool bVar18;
  bool bVar19;
  ulong uVar21;
  size_t sVar22;
  ulong *puVar23;
  ulong *puVar24;
  bcf_fmt_t *pbVar25;
  size_t sVar26;
  long lVar27;
  bcf1_t *pbVar28;
  int iVar29;
  long lVar30;
  bcf_info_t *pbVar31;
  char buf [16];
  undefined8 local_60;
  byte local_58 [16];
  bcf_fmt_t *local_48;
  ulong local_40;
  ulong local_38;
  bool bVar20;
  
  bcf_unpack(v,0xf);
  pcVar10 = h->id[1][v->rid].key;
  local_60 = v;
  sVar7 = strlen(pcVar10);
  sVar7 = (size_t)(int)sVar7;
  uVar8 = s->l + sVar7 + 1;
  if (uVar8 < s->m) {
LAB_0011b550:
    memcpy(s->s + s->l,pcVar10,sVar7);
    sVar26 = sVar7 + s->l;
    s->l = sVar26;
    s->s[sVar26] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    sVar22 = (uVar8 >> 0x10 | uVar8) + 1;
    s->m = sVar22;
    pcVar9 = (char *)realloc(s->s,sVar22);
    if (pcVar9 != (char *)0x0) {
      s->s = pcVar9;
      goto LAB_0011b550;
    }
  }
  pbVar28 = local_60;
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011b5cc:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
    s->m = sVar7;
    pcVar10 = (char *)realloc(s->s,sVar7);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b5cc;
    }
  }
  uVar6 = pbVar28->pos + 1;
  uVar14 = -uVar6;
  if (0 < (int)uVar6) {
    uVar14 = uVar6;
  }
  uVar8 = 0;
  do {
    local_58[uVar8] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
    uVar8 = uVar8 + 1;
    bVar18 = 9 < uVar14;
    uVar14 = uVar14 / 10;
  } while (bVar18);
  if ((int)uVar6 < 0) {
    uVar11 = uVar8 & 0xffffffff;
    uVar8 = (ulong)((int)uVar8 + 1);
    local_58[uVar11] = 0x2d;
  }
  uVar11 = s->l + (long)(int)uVar8 + 1;
  if (uVar11 < s->m) {
LAB_0011b692:
    iVar29 = (int)uVar8 + 1;
    pbVar12 = local_58 + ((uVar8 & 0xffffffff) - 1);
    do {
      bVar1 = *pbVar12;
      sVar26 = s->l;
      s->l = sVar26 + 1;
      s->s[sVar26] = bVar1;
      iVar29 = iVar29 + -1;
      pbVar12 = pbVar12 + -1;
    } while (1 < iVar29);
    s->s[s->l] = '\0';
  }
  else {
    uVar11 = uVar11 >> 1 | uVar11;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    sVar7 = (uVar11 >> 0x10 | uVar11) + 1;
    s->m = sVar7;
    pcVar10 = (char *)realloc(s->s,sVar7);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b692;
    }
  }
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011b723:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
    s->m = sVar7;
    pcVar10 = (char *)realloc(s->s,sVar7);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b723;
    }
  }
  puVar23 = (ulong *)(pbVar28->d).id;
  puVar24 = (ulong *)0x156037;
  if (puVar23 != (ulong *)0x0) {
    puVar24 = puVar23;
  }
  sVar7 = strlen((char *)puVar24);
  sVar7 = (size_t)(int)sVar7;
  uVar8 = s->l + sVar7 + 1;
  if (uVar8 < s->m) {
LAB_0011b7b7:
    memcpy(s->s + s->l,puVar24,sVar7);
    sVar26 = sVar7 + s->l;
    s->l = sVar26;
    s->s[sVar26] = '\0';
    puVar23 = puVar24;
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b7b7;
    }
  }
  pbVar28 = local_60;
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011b833:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b833;
    }
  }
  if (*(short *)&pbVar28->field_0x12 == 0) {
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011b961;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    pcVar10 = s->s + s->l;
LAB_0011b95c:
    *pcVar10 = '\0';
  }
  else {
    puVar24 = (ulong *)*(pbVar28->d).allele;
    sVar7 = strlen((char *)puVar24);
    sVar7 = (size_t)(int)sVar7;
    uVar8 = s->l + sVar7 + 1;
    if (uVar8 < s->m) {
LAB_0011b8cf:
      memcpy(s->s + s->l,puVar24,sVar7);
      sVar26 = sVar7 + s->l;
      s->l = sVar26;
      pcVar10 = s->s + sVar26;
      puVar23 = puVar24;
      goto LAB_0011b95c;
    }
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b8cf;
    }
  }
LAB_0011b961:
  pbVar28 = local_60;
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011b9bc:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011b9bc;
    }
  }
  if ((*(ushort *)&pbVar28->field_0x12 & 0xfffe) == 0) {
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011bb94;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
  else if ((*(ushort *)&pbVar28->field_0x12 & 0xfffe) != 0) {
    uVar8 = 1;
    do {
      if (1 < uVar8) {
        uVar11 = s->l + 1;
        if (s->m <= uVar11) {
          uVar11 = uVar11 >> 1 | uVar11;
          uVar11 = uVar11 >> 2 | uVar11;
          uVar11 = uVar11 >> 4 | uVar11;
          uVar11 = uVar11 >> 8 | uVar11;
          sVar7 = (uVar11 >> 0x10 | uVar11) + 1;
          s->m = sVar7;
          pcVar10 = (char *)realloc(s->s,sVar7);
          if (pcVar10 == (char *)0x0) goto LAB_0011ba78;
          s->s = pcVar10;
        }
        sVar26 = s->l;
        s->l = sVar26 + 1;
        s->s[sVar26] = ',';
        s->s[s->l] = '\0';
      }
LAB_0011ba78:
      puVar24 = (ulong *)(pbVar28->d).allele[uVar8];
      sVar7 = strlen((char *)puVar24);
      sVar7 = (size_t)(int)sVar7;
      uVar11 = s->l + sVar7 + 1;
      if (uVar11 < s->m) {
LAB_0011bae8:
        memcpy(s->s + s->l,puVar24,sVar7);
        sVar26 = sVar7 + s->l;
        s->l = sVar26;
        s->s[sVar26] = '\0';
        puVar23 = puVar24;
      }
      else {
        uVar11 = uVar11 >> 1 | uVar11;
        uVar11 = uVar11 >> 2 | uVar11;
        uVar11 = uVar11 >> 4 | uVar11;
        uVar11 = uVar11 >> 8 | uVar11;
        puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
        s->m = (size_t)puVar23;
        pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
        if (pcVar10 != (char *)0x0) {
          s->s = pcVar10;
          goto LAB_0011bae8;
        }
      }
      uVar8 = uVar8 + 1;
      pbVar28 = local_60;
    } while (uVar8 < *(ushort *)&local_60->field_0x12);
  }
LAB_0011bb94:
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011bbea:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011bbea;
    }
  }
  if ((float)bcf_float_missing == pbVar28->qual) {
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011bca3;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
  else {
    puVar23 = (ulong *)0x1594b0;
    ksprintf(s,"%g",(double)pbVar28->qual);
  }
LAB_0011bca3:
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011bcf9:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011bcf9;
    }
  }
  if ((pbVar28->d).n_flt == 0) {
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011becf;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
  else if (0 < (pbVar28->d).n_flt) {
    lVar30 = 0;
    do {
      if (lVar30 != 0) {
        uVar8 = s->l + 1;
        if (s->m <= uVar8) {
          uVar8 = uVar8 >> 1 | uVar8;
          uVar8 = uVar8 >> 2 | uVar8;
          uVar8 = uVar8 >> 4 | uVar8;
          uVar8 = uVar8 >> 8 | uVar8;
          sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
          s->m = sVar7;
          pcVar10 = (char *)realloc(s->s,sVar7);
          if (pcVar10 == (char *)0x0) goto LAB_0011bda7;
          s->s = pcVar10;
        }
        sVar26 = s->l;
        s->l = sVar26 + 1;
        s->s[sVar26] = ';';
        s->s[s->l] = '\0';
      }
LAB_0011bda7:
      puVar24 = (ulong *)h->id[0][(pbVar28->d).flt[lVar30]].key;
      sVar7 = strlen((char *)puVar24);
      sVar7 = (size_t)(int)sVar7;
      uVar8 = s->l + sVar7 + 1;
      if (uVar8 < s->m) {
LAB_0011be24:
        memcpy(s->s + s->l,puVar24,sVar7);
        sVar26 = sVar7 + s->l;
        s->l = sVar26;
        s->s[sVar26] = '\0';
        puVar23 = puVar24;
      }
      else {
        uVar8 = uVar8 >> 1 | uVar8;
        uVar8 = uVar8 >> 2 | uVar8;
        uVar8 = uVar8 >> 4 | uVar8;
        uVar8 = uVar8 >> 8 | uVar8;
        puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
        s->m = (size_t)puVar23;
        pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
        if (pcVar10 != (char *)0x0) {
          s->s = pcVar10;
          goto LAB_0011be24;
        }
      }
      lVar30 = lVar30 + 1;
      pbVar28 = local_60;
    } while (lVar30 < (local_60->d).n_flt);
  }
LAB_0011becf:
  uVar8 = s->l + 1;
  if (uVar8 < s->m) {
LAB_0011bf25:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011bf25;
    }
  }
  if ((*(short *)&pbVar28->field_0x10 == 0) || (*(short *)&pbVar28->field_0x10 == 0)) {
LAB_0011c52b:
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011c59e;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
  else {
    bVar18 = true;
    uVar8 = 0;
    do {
      pbVar31 = (pbVar28->d).info;
      pbVar28 = local_60;
      if (pbVar31[uVar8].vptr != (uint8_t *)0x0) {
        if (!bVar18) {
          uVar11 = s->l + 1;
          if (s->m <= uVar11) {
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            sVar7 = (uVar11 >> 0x10 | uVar11) + 1;
            s->m = sVar7;
            pcVar10 = (char *)realloc(s->s,sVar7);
            if (pcVar10 == (char *)0x0) goto LAB_0011bff9;
            s->s = pcVar10;
          }
          sVar26 = s->l;
          s->l = sVar26 + 1;
          s->s[sVar26] = ';';
          s->s[s->l] = '\0';
        }
LAB_0011bff9:
        pbVar31 = pbVar31 + uVar8;
        puVar24 = (ulong *)h->id[0][pbVar31->key].key;
        sVar7 = strlen((char *)puVar24);
        sVar7 = (size_t)(int)sVar7;
        uVar11 = s->l + sVar7 + 1;
        if (uVar11 < s->m) {
LAB_0011c074:
          memcpy(s->s + s->l,puVar24,sVar7);
          sVar26 = sVar7 + s->l;
          s->l = sVar26;
          s->s[sVar26] = '\0';
          puVar23 = puVar24;
        }
        else {
          uVar11 = uVar11 >> 1 | uVar11;
          uVar11 = uVar11 >> 2 | uVar11;
          uVar11 = uVar11 >> 4 | uVar11;
          uVar11 = uVar11 >> 8 | uVar11;
          puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
          s->m = (size_t)puVar23;
          pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
          if (pcVar10 != (char *)0x0) {
            s->s = pcVar10;
            goto LAB_0011c074;
          }
        }
        pbVar28 = local_60;
        bVar19 = false;
        bVar20 = false;
        bVar18 = bVar19;
        if (0 < pbVar31->len) {
          uVar11 = s->l + 1;
          if (uVar11 < s->m) {
LAB_0011c0fc:
            sVar26 = s->l;
            s->l = sVar26 + 1;
            s->s[sVar26] = '=';
            s->s[s->l] = '\0';
          }
          else {
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            sVar7 = (uVar11 >> 0x10 | uVar11) + 1;
            s->m = sVar7;
            pcVar10 = (char *)realloc(s->s,sVar7);
            if (pcVar10 != (char *)0x0) {
              s->s = pcVar10;
              goto LAB_0011c0fc;
            }
          }
          uVar14 = pbVar31->type;
          uVar11 = (ulong)uVar14;
          uVar6 = pbVar31->len;
          puVar23 = (ulong *)(ulong)uVar6;
          if (uVar6 == 1) {
            switch(uVar14) {
            case 1:
              uVar14 = (pbVar31->v1).i;
              if (uVar14 == 0xffffff80) {
LAB_0011c3cc:
                uVar11 = s->l + 1;
                if (s->m <= uVar11) {
                  uVar11 = uVar11 >> 1 | uVar11;
                  uVar11 = uVar11 >> 2 | uVar11;
                  uVar11 = uVar11 >> 4 | uVar11;
                  uVar11 = uVar11 >> 8 | uVar11;
                  puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
                  s->m = (size_t)puVar23;
                  pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                  bVar18 = bVar20;
                  if (pcVar10 == (char *)0x0) goto LAB_0011c43f;
                  s->s = pcVar10;
                }
                sVar26 = s->l;
                s->l = sVar26 + 1;
                s->s[sVar26] = '.';
              }
              else {
                uVar6 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar6 = uVar14;
                }
                uVar11 = 0;
                do {
                  local_58[uVar11] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
                  uVar11 = uVar11 + 1;
                  bVar18 = 9 < uVar6;
                  uVar6 = uVar6 / 10;
                } while (bVar18);
                if ((int)uVar14 < 0) {
                  uVar21 = uVar11 & 0xffffffff;
                  uVar11 = (ulong)((int)uVar11 + 1);
                  local_58[uVar21] = 0x2d;
                }
                uVar21 = s->l + (long)(int)uVar11 + 1;
                if (s->m <= uVar21) {
                  uVar21 = uVar21 >> 1 | uVar21;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
                  s->m = (size_t)puVar23;
                  pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                  bVar18 = bVar20;
                  if (pcVar10 == (char *)0x0) goto LAB_0011c43f;
                  s->s = pcVar10;
                }
                iVar29 = (int)uVar11 + 1;
                pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
                do {
                  bVar1 = *pbVar12;
                  sVar26 = s->l;
                  puVar23 = (ulong *)s->s;
                  s->l = sVar26 + 1;
                  *(byte *)((long)puVar23 + sVar26) = bVar1;
                  iVar29 = iVar29 + -1;
                  pbVar12 = pbVar12 + -1;
                } while (1 < iVar29);
              }
              break;
            case 2:
              uVar14 = (pbVar31->v1).i;
              if (uVar14 == 0xffff8000) goto LAB_0011c3cc;
              uVar6 = -uVar14;
              if (0 < (int)uVar14) {
                uVar6 = uVar14;
              }
              uVar11 = 0;
              do {
                local_58[uVar11] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
                uVar11 = uVar11 + 1;
                bVar18 = 9 < uVar6;
                uVar6 = uVar6 / 10;
              } while (bVar18);
              if ((int)uVar14 < 0) {
                uVar21 = uVar11 & 0xffffffff;
                uVar11 = (ulong)((int)uVar11 + 1);
                local_58[uVar21] = 0x2d;
              }
              uVar21 = s->l + (long)(int)uVar11 + 1;
              if (s->m <= uVar21) {
                uVar21 = uVar21 >> 1 | uVar21;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
                s->m = (size_t)puVar23;
                pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                bVar18 = bVar20;
                if (pcVar10 == (char *)0x0) goto LAB_0011c43f;
                s->s = pcVar10;
              }
              iVar29 = (int)uVar11 + 1;
              pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
              do {
                bVar1 = *pbVar12;
                sVar26 = s->l;
                puVar23 = (ulong *)s->s;
                s->l = sVar26 + 1;
                *(byte *)((long)puVar23 + sVar26) = bVar1;
                iVar29 = iVar29 + -1;
                pbVar12 = pbVar12 + -1;
              } while (1 < iVar29);
              break;
            case 3:
              uVar14 = (pbVar31->v1).i;
              uVar6 = -uVar14;
              if (0 < (int)uVar14) {
                uVar6 = uVar14;
              }
              uVar11 = 0;
              do {
                local_58[uVar11] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
                uVar11 = uVar11 + 1;
                bVar18 = 9 < uVar6;
                uVar6 = uVar6 / 10;
              } while (bVar18);
              if ((int)uVar14 < 0) {
                uVar21 = uVar11 & 0xffffffff;
                uVar11 = (ulong)((int)uVar11 + 1);
                local_58[uVar21] = 0x2d;
              }
              uVar21 = s->l + (long)(int)uVar11 + 1;
              if (s->m <= uVar21) {
                uVar21 = uVar21 >> 1 | uVar21;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
                s->m = (size_t)puVar23;
                pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                bVar18 = bVar20;
                if (pcVar10 == (char *)0x0) goto LAB_0011c43f;
                s->s = pcVar10;
              }
              iVar29 = (int)uVar11 + 1;
              pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
              do {
                bVar1 = *pbVar12;
                sVar26 = s->l;
                puVar23 = (ulong *)s->s;
                s->l = sVar26 + 1;
                *(byte *)((long)puVar23 + sVar26) = bVar1;
                iVar29 = iVar29 + -1;
                pbVar12 = pbVar12 + -1;
              } while (1 < iVar29);
              break;
            default:
              goto switchD_0011c144_caseD_4;
            case 5:
              if ((float)bcf_float_missing == (pbVar31->v1).f) goto LAB_0011c3cc;
              puVar23 = (ulong *)0x1594b0;
              ksprintf(s,"%g",(double)(pbVar31->v1).f);
              bVar18 = bVar20;
              goto LAB_0011c43f;
            case 7:
              iVar2 = (pbVar31->v1).i;
              uVar11 = s->l + 1;
              if (s->m <= uVar11) {
                uVar11 = uVar11 >> 1 | uVar11;
                uVar11 = uVar11 >> 2 | uVar11;
                uVar11 = uVar11 >> 4 | uVar11;
                uVar11 = uVar11 >> 8 | uVar11;
                puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
                s->m = (size_t)puVar23;
                pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                if (pcVar10 == (char *)0x0) goto LAB_0011c43f;
                s->s = pcVar10;
              }
              sVar26 = s->l;
              s->l = sVar26 + 1;
              s->s[sVar26] = (char)iVar2;
            }
            s->s[s->l] = '\0';
            bVar18 = bVar19;
          }
          else {
            bcf_fmt_array(s,uVar6,uVar14,pbVar31->vptr);
          }
        }
      }
LAB_0011c43f:
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(ushort *)&pbVar28->field_0x10);
    if (bVar18) goto LAB_0011c52b;
  }
LAB_0011c59e:
  if (*(ulong *)&pbVar28->field_0x10 >> 0x28 == 0) goto LAB_0011d1cc;
  if ((*(ulong *)&pbVar28->field_0x10 & 0xff00000000) == 0) {
    uVar14 = 0xffffffff;
    do {
      uVar8 = s->l + 3;
      if (uVar8 < s->m) {
LAB_0011c7ca:
        sVar26 = s->l;
        pcVar10 = s->s;
        (pcVar10 + sVar26)[0] = '\t';
        (pcVar10 + sVar26)[1] = '.';
        sVar26 = s->l;
        s->l = sVar26 + 2;
        s->s[sVar26 + 2] = '\0';
      }
      else {
        uVar8 = uVar8 >> 1 | uVar8;
        uVar8 = uVar8 >> 2 | uVar8;
        uVar8 = uVar8 >> 4 | uVar8;
        uVar8 = uVar8 >> 8 | uVar8;
        sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
        s->m = sVar7;
        pcVar10 = (char *)realloc(s->s,sVar7);
        if (pcVar10 != (char *)0x0) {
          s->s = pcVar10;
          goto LAB_0011c7ca;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (uint)((ulong)*(undefined8 *)&pbVar28->field_0x10 >> 0x28));
    goto LAB_0011d1cc;
  }
  pbVar25 = (pbVar28->d).fmt;
  local_48 = pbVar25;
  if ((*(ulong *)&pbVar28->field_0x10 & 0xff00000000) == 0) {
    local_38 = 0xffffffff;
    bVar18 = false;
  }
  else {
    uVar8 = 0xffffffff;
    bVar18 = true;
    uVar11 = 0;
    do {
      if (pbVar25->p != (uint8_t *)0x0) {
        uVar21 = s->l + 1;
        if (uVar21 < s->m) {
LAB_0011c648:
          cVar5 = '\t';
          if (!bVar18) {
            cVar5 = ':';
          }
          sVar26 = s->l;
          puVar23 = (ulong *)(sVar26 + 1);
          s->l = (size_t)puVar23;
          s->s[sVar26] = cVar5;
          s->s[s->l] = '\0';
        }
        else {
          uVar21 = uVar21 >> 1 | uVar21;
          uVar21 = uVar21 >> 2 | uVar21;
          uVar21 = uVar21 >> 4 | uVar21;
          uVar21 = uVar21 >> 8 | uVar21;
          puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
          s->m = (size_t)puVar23;
          pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
          if (pcVar10 != (char *)0x0) {
            s->s = pcVar10;
            goto LAB_0011c648;
          }
        }
        if ((long)pbVar25->id < 0) goto LAB_0011d255;
        pcVar10 = h->id[0][pbVar25->id].key;
        sVar7 = strlen(pcVar10);
        sVar7 = (size_t)(int)sVar7;
        uVar21 = s->l + sVar7 + 1;
        if (uVar21 < s->m) {
LAB_0011c6f5:
          memcpy(s->s + s->l,pcVar10,sVar7);
          sVar26 = sVar7 + s->l;
          s->l = sVar26;
          s->s[sVar26] = '\0';
        }
        else {
          uVar21 = uVar21 >> 1 | uVar21;
          uVar21 = uVar21 >> 2 | uVar21;
          uVar21 = uVar21 >> 4 | uVar21;
          uVar21 = uVar21 >> 8 | uVar21;
          sVar22 = (uVar21 >> 0x10 | uVar21) + 1;
          s->m = sVar22;
          pcVar9 = (char *)realloc(s->s,sVar22);
          if (pcVar9 != (char *)0x0) {
            s->s = pcVar9;
            goto LAB_0011c6f5;
          }
        }
        puVar23 = (ulong *)0x157fa3;
        iVar29 = strcmp(h->id[0][pbVar25->id].key,"GT");
        if (iVar29 == 0) {
          uVar8 = uVar11 & 0xffffffff;
        }
        bVar18 = false;
        pbVar28 = local_60;
      }
      uVar11 = uVar11 + 1;
      pbVar25 = pbVar25 + 1;
    } while (uVar11 < (byte)pbVar28->field_0x14);
    bVar18 = !bVar18;
    local_38 = uVar8;
  }
  pbVar25 = local_48;
  if (!bVar18) {
    uVar8 = s->l + 3;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011c892;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    pcVar10 = s->s;
    (pcVar10 + sVar26)[0] = '\t';
    (pcVar10 + sVar26)[1] = '.';
    sVar26 = s->l;
    s->l = sVar26 + 2;
    s->s[sVar26 + 2] = '\0';
  }
LAB_0011c892:
  if (0xffffffffff < *(ulong *)&pbVar28->field_0x10) {
    local_40 = 0;
LAB_0011c8ab:
    uVar8 = s->l + 1;
    if (uVar8 < s->m) {
LAB_0011c901:
      sVar26 = s->l;
      s->l = sVar26 + 1;
      s->s[sVar26] = '\t';
      s->s[s->l] = '\0';
    }
    else {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 != (char *)0x0) {
        s->s = pcVar10;
        goto LAB_0011c901;
      }
    }
    if ((*(ulong *)&pbVar28->field_0x10 & 0xff00000000) != 0) {
      bVar18 = true;
      uVar8 = 0;
LAB_0011c93a:
      if (pbVar25[uVar8].p == (uint8_t *)0x0) goto LAB_0011d08d;
      if (!bVar18) {
        uVar11 = s->l + 1;
        if (s->m <= uVar11) {
          uVar11 = uVar11 >> 1 | uVar11;
          uVar11 = uVar11 >> 2 | uVar11;
          uVar11 = uVar11 >> 4 | uVar11;
          uVar11 = uVar11 >> 8 | uVar11;
          puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
          s->m = (size_t)puVar23;
          pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
          if (pcVar10 == (char *)0x0) goto LAB_0011c9c5;
          s->s = pcVar10;
        }
        sVar26 = s->l;
        s->l = sVar26 + 1;
        s->s[sVar26] = ':';
        s->s[s->l] = '\0';
      }
LAB_0011c9c5:
      if (local_38 != uVar8) {
        puVar23 = (ulong *)(ulong)(uint)pbVar25[uVar8].n;
        bcf_fmt_array(s,pbVar25[uVar8].n,pbVar25[uVar8].type,
                      pbVar25[uVar8].p + (long)(int)local_40 * (long)pbVar25[uVar8].size);
        goto LAB_0011cc38;
      }
      iVar29 = pbVar25[uVar8].type;
      if (iVar29 == 3) {
        if (0 < pbVar25[uVar8].n) {
          lVar27 = (long)(int)local_40 * (long)pbVar25[uVar8].size;
          puVar3 = pbVar25[uVar8].p;
          lVar30 = 0;
          do {
            uVar14 = *(uint *)(puVar3 + lVar30 * 4 + lVar27);
            if (uVar14 == 0x80000001) goto LAB_0011d0ab;
            if (lVar30 != 0) {
              cVar5 = "/|"[uVar14 & 1];
              uVar11 = s->l + 1;
              if (s->m <= uVar11) {
                uVar11 = uVar11 >> 1 | uVar11;
                uVar11 = uVar11 >> 2 | uVar11;
                uVar11 = uVar11 >> 4 | uVar11;
                uVar11 = uVar11 >> 8 | uVar11;
                puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
                s->m = (size_t)puVar23;
                pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                if (pcVar10 == (char *)0x0) goto LAB_0011cf21;
                s->s = pcVar10;
              }
              sVar26 = s->l;
              s->l = sVar26 + 1;
              s->s[sVar26] = cVar5;
              s->s[s->l] = '\0';
            }
LAB_0011cf21:
            uVar14 = *(uint *)(puVar3 + lVar30 * 4 + lVar27);
            if (uVar14 < 2) {
              uVar11 = s->l + 1;
              if (uVar11 < s->m) {
LAB_0011cf84:
                sVar26 = s->l;
                s->l = sVar26 + 1;
                s->s[sVar26] = '.';
                goto LAB_0011d062;
              }
              uVar11 = uVar11 >> 1 | uVar11;
              uVar11 = uVar11 >> 2 | uVar11;
              uVar11 = uVar11 >> 4 | uVar11;
              uVar11 = uVar11 >> 8 | uVar11;
              puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
              s->m = (size_t)puVar23;
              pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
              if (pcVar10 != (char *)0x0) {
                s->s = pcVar10;
                goto LAB_0011cf84;
              }
            }
            else {
              iVar29 = (int)uVar14 >> 1;
              uVar14 = iVar29 - 1;
              uVar6 = -uVar14;
              if (0 < (int)uVar14) {
                uVar6 = uVar14;
              }
              uVar11 = 0;
              do {
                local_58[uVar11] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
                uVar11 = uVar11 + 1;
                bVar18 = 9 < uVar6;
                uVar6 = uVar6 / 10;
              } while (bVar18);
              if (iVar29 < 1) {
                uVar21 = uVar11 & 0xffffffff;
                uVar11 = (ulong)((int)uVar11 + 1);
                local_58[uVar21] = 0x2d;
              }
              uVar21 = s->l + (long)(int)uVar11 + 1;
              if (s->m <= uVar21) {
                uVar21 = uVar21 >> 1 | uVar21;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
                s->m = (size_t)puVar23;
                pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
                if (pcVar10 == (char *)0x0) goto LAB_0011d06d;
                s->s = pcVar10;
              }
              iVar29 = (int)uVar11 + 1;
              pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
              do {
                bVar1 = *pbVar12;
                sVar26 = s->l;
                puVar23 = (ulong *)s->s;
                s->l = sVar26 + 1;
                *(byte *)((long)puVar23 + sVar26) = bVar1;
                iVar29 = iVar29 + -1;
                pbVar12 = pbVar12 + -1;
              } while (1 < iVar29);
LAB_0011d062:
              s->s[s->l] = '\0';
            }
LAB_0011d06d:
            lVar30 = lVar30 + 1;
          } while (lVar30 < pbVar25[uVar8].n);
          goto LAB_0011d07d;
        }
        goto LAB_0011d0bb;
      }
      if (iVar29 == 2) {
        if (pbVar25[uVar8].n < 1) goto LAB_0011d0bb;
        lVar27 = (long)(int)local_40 * (long)pbVar25[uVar8].size;
        puVar3 = pbVar25[uVar8].p;
        lVar30 = 0;
        do {
          uVar17 = *(ushort *)(puVar3 + lVar30 * 2 + lVar27);
          if (uVar17 == 0x8001) goto LAB_0011d0ab;
          if (lVar30 != 0) {
            cVar5 = "/|"[uVar17 & 1];
            uVar11 = s->l + 1;
            if (s->m <= uVar11) {
              uVar11 = uVar11 >> 1 | uVar11;
              uVar11 = uVar11 >> 2 | uVar11;
              uVar11 = uVar11 >> 4 | uVar11;
              uVar11 = uVar11 >> 8 | uVar11;
              puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
              s->m = (size_t)puVar23;
              pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
              if (pcVar10 == (char *)0x0) goto LAB_0011ccfa;
              s->s = pcVar10;
            }
            sVar26 = s->l;
            s->l = sVar26 + 1;
            s->s[sVar26] = cVar5;
            s->s[s->l] = '\0';
          }
LAB_0011ccfa:
          uVar17 = *(ushort *)(puVar3 + lVar30 * 2 + lVar27);
          if (uVar17 < 2) {
            uVar11 = s->l + 1;
            if (uVar11 < s->m) {
LAB_0011cd60:
              sVar26 = s->l;
              s->l = sVar26 + 1;
              s->s[sVar26] = '.';
              goto LAB_0011ce46;
            }
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
            s->m = (size_t)puVar23;
            pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
            if (pcVar10 != (char *)0x0) {
              s->s = pcVar10;
              goto LAB_0011cd60;
            }
          }
          else {
            sVar4 = (short)((uint)(int)(short)uVar17 >> 1);
            uVar16 = sVar4 - 1;
            uVar17 = -uVar16;
            if (0 < (short)uVar16) {
              uVar17 = uVar16;
            }
            uVar11 = 0;
            uVar14 = (uint)uVar17;
            do {
              local_58[uVar11] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
              uVar11 = uVar11 + 1;
              bVar18 = 9 < uVar14;
              uVar14 = uVar14 / 10;
            } while (bVar18);
            if (sVar4 < 1) {
              uVar21 = uVar11 & 0xffffffff;
              uVar11 = (ulong)((int)uVar11 + 1);
              local_58[uVar21] = 0x2d;
            }
            uVar21 = s->l + (long)(int)uVar11 + 1;
            if (s->m <= uVar21) {
              uVar21 = uVar21 >> 1 | uVar21;
              uVar21 = uVar21 >> 2 | uVar21;
              uVar21 = uVar21 >> 4 | uVar21;
              uVar21 = uVar21 >> 8 | uVar21;
              puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
              s->m = (size_t)puVar23;
              pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
              if (pcVar10 == (char *)0x0) goto LAB_0011ce51;
              s->s = pcVar10;
            }
            iVar29 = (int)uVar11 + 1;
            pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
            do {
              bVar1 = *pbVar12;
              sVar26 = s->l;
              puVar23 = (ulong *)s->s;
              s->l = sVar26 + 1;
              *(byte *)((long)puVar23 + sVar26) = bVar1;
              iVar29 = iVar29 + -1;
              pbVar12 = pbVar12 + -1;
            } while (1 < iVar29);
LAB_0011ce46:
            s->s[s->l] = '\0';
          }
LAB_0011ce51:
          lVar30 = lVar30 + 1;
        } while (lVar30 < pbVar25[uVar8].n);
      }
      else {
        if (iVar29 != 1) {
          vcf_format_cold_3();
          goto LAB_0011d255;
        }
        if (pbVar25[uVar8].n < 1) goto LAB_0011d0bb;
        lVar27 = (long)(int)local_40 * (long)pbVar25[uVar8].size;
        puVar3 = pbVar25[uVar8].p;
        lVar30 = 0;
        do {
          bVar1 = puVar3[lVar30 + lVar27];
          if (bVar1 == 0x81) goto LAB_0011d0ab;
          if (lVar30 != 0) {
            cVar5 = "/|"[bVar1 & 1];
            uVar11 = s->l + 1;
            if (s->m <= uVar11) {
              uVar11 = uVar11 >> 1 | uVar11;
              uVar11 = uVar11 >> 2 | uVar11;
              uVar11 = uVar11 >> 4 | uVar11;
              uVar11 = uVar11 >> 8 | uVar11;
              puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
              s->m = (size_t)puVar23;
              pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
              if (pcVar10 == (char *)0x0) goto LAB_0011cab1;
              s->s = pcVar10;
            }
            sVar26 = s->l;
            s->l = sVar26 + 1;
            s->s[sVar26] = cVar5;
            s->s[s->l] = '\0';
          }
LAB_0011cab1:
          bVar1 = puVar3[lVar30 + lVar27];
          if (bVar1 < 2) {
            uVar11 = s->l + 1;
            if (uVar11 < s->m) {
LAB_0011cb14:
              sVar26 = s->l;
              s->l = sVar26 + 1;
              s->s[sVar26] = '.';
              goto LAB_0011cbf7;
            }
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
            s->m = (size_t)puVar23;
            pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
            if (pcVar10 != (char *)0x0) {
              s->s = pcVar10;
              goto LAB_0011cb14;
            }
          }
          else {
            cVar5 = (char)bVar1 >> 1;
            bVar1 = cVar5 - 1;
            bVar15 = (char)bVar1 >> 7;
            uVar11 = 0;
            uVar14 = (uint)(byte)((bVar1 ^ bVar15) - bVar15);
            do {
              local_58[uVar11] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
              uVar11 = uVar11 + 1;
              bVar18 = 9 < uVar14;
              uVar14 = uVar14 / 10;
            } while (bVar18);
            if (cVar5 < '\x01') {
              uVar21 = uVar11 & 0xffffffff;
              uVar11 = (ulong)((int)uVar11 + 1);
              local_58[uVar21] = 0x2d;
            }
            uVar21 = s->l + (long)(int)uVar11 + 1;
            if (s->m <= uVar21) {
              uVar21 = uVar21 >> 1 | uVar21;
              uVar21 = uVar21 >> 2 | uVar21;
              uVar21 = uVar21 >> 4 | uVar21;
              uVar21 = uVar21 >> 8 | uVar21;
              puVar23 = (ulong *)((uVar21 >> 0x10 | uVar21) + 1);
              s->m = (size_t)puVar23;
              pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
              if (pcVar10 == (char *)0x0) goto LAB_0011cc02;
              s->s = pcVar10;
            }
            iVar29 = (int)uVar11 + 1;
            pbVar12 = local_58 + ((uVar11 & 0xffffffff) - 1);
            do {
              bVar1 = *pbVar12;
              sVar26 = s->l;
              puVar23 = (ulong *)s->s;
              s->l = sVar26 + 1;
              *(byte *)((long)puVar23 + sVar26) = bVar1;
              iVar29 = iVar29 + -1;
              pbVar12 = pbVar12 + -1;
            } while (1 < iVar29);
LAB_0011cbf7:
            s->s[s->l] = '\0';
          }
LAB_0011cc02:
          lVar30 = lVar30 + 1;
        } while (lVar30 < pbVar25[uVar8].n);
      }
LAB_0011d07d:
      bVar18 = false;
      pbVar25 = local_48;
      pbVar28 = local_60;
      goto LAB_0011d08d;
    }
    goto LAB_0011d13d;
  }
LAB_0011d1cc:
  uVar8 = s->l + 1;
  if (s->m <= uVar8) {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
    s->m = sVar7;
    pcVar10 = (char *)realloc(s->s,sVar7);
    if (pcVar10 == (char *)0x0) {
      return 0;
    }
    s->s = pcVar10;
  }
  sVar26 = s->l;
  s->l = sVar26 + 1;
  s->s[sVar26] = '\n';
  s->s[s->l] = '\0';
  return 0;
LAB_0011d0ab:
  pbVar25 = local_48;
  pbVar28 = local_60;
  if (lVar30 != 0) {
LAB_0011cc38:
    bVar18 = false;
    goto LAB_0011d08d;
  }
LAB_0011d0bb:
  uVar11 = s->l + 1;
  if (uVar11 < s->m) {
LAB_0011d115:
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
  else {
    uVar11 = uVar11 >> 1 | uVar11;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    puVar23 = (ulong *)((uVar11 >> 0x10 | uVar11) + 1);
    s->m = (size_t)puVar23;
    pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
    if (pcVar10 != (char *)0x0) {
      s->s = pcVar10;
      goto LAB_0011d115;
    }
  }
  bVar18 = false;
LAB_0011d08d:
  uVar8 = uVar8 + 1;
  if ((byte)pbVar28->field_0x14 <= uVar8) goto LAB_0011d139;
  goto LAB_0011c93a;
LAB_0011d139:
  if (bVar18) {
LAB_0011d13d:
    uVar8 = s->l + 1;
    if (s->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      puVar23 = (ulong *)((uVar8 >> 0x10 | uVar8) + 1);
      s->m = (size_t)puVar23;
      pcVar10 = (char *)realloc(s->s,(size_t)puVar23);
      if (pcVar10 == (char *)0x0) goto LAB_0011d1b0;
      s->s = pcVar10;
    }
    sVar26 = s->l;
    s->l = sVar26 + 1;
    s->s[sVar26] = '.';
    s->s[s->l] = '\0';
  }
LAB_0011d1b0:
  uVar14 = (int)local_40 + 1;
  local_40 = (ulong)uVar14;
  if ((uint)((ulong)*(undefined8 *)&pbVar28->field_0x10 >> 0x28) <= uVar14) goto LAB_0011d1cc;
  goto LAB_0011c8ab;
LAB_0011d255:
  vcf_format_cold_2();
  uVar11 = extraout_RDX;
switchD_0011c144_caseD_4:
  uVar11 = uVar11 & 0xffffffff;
  vcf_format_cold_1();
  if (*(char *)((long)puVar23[2] + (*puVar23 - 1)) != '\n') {
    uVar8 = *puVar23 + 1;
    if (puVar23[1] <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      sVar7 = (uVar8 >> 0x10 | uVar8) + 1;
      puVar23[1] = sVar7;
      pvVar13 = realloc((void *)puVar23[2],sVar7);
      if (pvVar13 == (void *)0x0) goto LAB_0011d2ec;
      puVar23[2] = (ulong)pvVar13;
    }
    uVar8 = *puVar23;
    *puVar23 = uVar8 + 1;
    *(undefined1 *)(puVar23[2] + uVar8) = 10;
    *(undefined1 *)(puVar23[2] + *puVar23) = 0;
  }
LAB_0011d2ec:
  fp = *(BGZF **)(uVar11 + 0x38);
  uVar8 = *puVar23;
  pvVar13 = (void *)puVar23[2];
  if (*(int *)(uVar11 + 0x4c) == 0) {
    uVar21 = fp->uncompressed_address - (long)*(void **)&fp->block_length;
    uVar11 = uVar8;
    if (uVar21 < uVar8) {
      uVar11 = uVar21;
    }
    memcpy(*(void **)&fp->block_length,pvVar13,uVar11);
    *(ulong *)&fp->block_length = *(long *)&fp->block_length + uVar11;
    if (uVar21 < uVar8) {
      uVar11 = hwrite2((hFILE *)fp,pvVar13,uVar8,uVar11);
    }
  }
  else {
    uVar11 = bgzf_write(fp,pvVar13,uVar8);
  }
  return -(uint)((long)(int)uVar11 != *puVar23);
}

Assistant:

int vcf_format(const bcf_hdr_t *h, const bcf1_t *v, kstring_t *s)
{
    int i;
    bcf_unpack((bcf1_t*)v, BCF_UN_ALL);
    kputs(h->id[BCF_DT_CTG][v->rid].key, s); // CHROM
    kputc('\t', s); kputw(v->pos + 1, s); // POS
    kputc('\t', s); kputs(v->d.id ? v->d.id : ".", s); // ID
    kputc('\t', s); // REF
    if (v->n_allele > 0) kputs(v->d.allele[0], s);
    else kputc('.', s);
    kputc('\t', s); // ALT
    if (v->n_allele > 1) {
        for (i = 1; i < v->n_allele; ++i) {
            if (i > 1) kputc(',', s);
            kputs(v->d.allele[i], s);
        }
    } else kputc('.', s);
    kputc('\t', s); // QUAL
    if ( bcf_float_is_missing(v->qual) ) kputc('.', s); // QUAL
    else ksprintf(s, "%g", v->qual);
    kputc('\t', s); // FILTER
    if (v->d.n_flt) {
        for (i = 0; i < v->d.n_flt; ++i) {
            if (i) kputc(';', s);
            kputs(h->id[BCF_DT_ID][v->d.flt[i]].key, s);
        }
    } else kputc('.', s);
    kputc('\t', s); // INFO
    if (v->n_info) {
        int first = 1;
        for (i = 0; i < v->n_info; ++i) {
            bcf_info_t *z = &v->d.info[i];
            if ( !z->vptr ) continue;
            if ( !first ) kputc(';', s); first = 0;
            kputs(h->id[BCF_DT_ID][z->key].key, s);
            if (z->len <= 0) continue;
            kputc('=', s);
            if (z->len == 1) 
            {
                switch (z->type) 
                {
                    case BCF_BT_INT8:  if ( z->v1.i==bcf_int8_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT16: if ( z->v1.i==bcf_int16_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT32: if ( z->v1.i==bcf_int32_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_FLOAT: if ( bcf_float_is_missing(z->v1.f) ) kputc('.', s); else ksprintf(s, "%g", z->v1.f); break;
                    case BCF_BT_CHAR:  kputc(z->v1.i, s); break;
                    default: fprintf(stderr,"todo: type %d\n", z->type); exit(1); break;
                }
            }
            else bcf_fmt_array(s, z->len, z->type, z->vptr);
        }
        if ( first ) kputc('.', s);
    } else kputc('.', s);
    // FORMAT and individual information
    if (v->n_sample)
    {
        int i,j;
        if ( v->n_fmt)
        {
            int gt_i = -1;
            bcf_fmt_t *fmt = v->d.fmt;
            int first = 1;
            for (i = 0; i < (int)v->n_fmt; ++i) {
                if ( !fmt[i].p ) continue;
                kputc(!first ? ':' : '\t', s); first = 0;
                if ( fmt[i].id<0 ) //!bcf_hdr_idinfo_exists(h,BCF_HL_FMT,fmt[i].id) )
                {
                    fprintf(stderr, "[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n", __func__, fmt[i].id);
                    abort();
                }
                kputs(h->id[BCF_DT_ID][fmt[i].id].key, s);
                if (strcmp(h->id[BCF_DT_ID][fmt[i].id].key, "GT") == 0) gt_i = i;
            }
            if ( first ) kputs("\t.", s);
            for (j = 0; j < v->n_sample; ++j) {
                kputc('\t', s);
                first = 1;
                for (i = 0; i < (int)v->n_fmt; ++i) {
                    bcf_fmt_t *f = &fmt[i];
                    if ( !f->p ) continue;
                    if (!first) kputc(':', s); first = 0;
                    if (gt_i == i)
                        bcf_format_gt(f,j,s);
                    else
                        bcf_fmt_array(s, f->n, f->type, f->p + j * f->size);
                }
                if ( first ) kputc('.', s);
            }
        }
        else
            for (j=0; j<=v->n_sample; j++)
                kputs("\t.", s);
    }
    kputc('\n', s);
    return 0;
}